

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall
kj::_::BTreeImpl::renumber(BTreeImpl *this,uint oldRow,uint newRow,SearchKey *searchKey)

{
  bool bVar1;
  uint uVar2;
  NodeUnion *pNVar3;
  uint r;
  Leaf *leaf;
  Fault local_60;
  Fault f;
  uint indexInParent;
  Parent *node;
  Iterator local_40;
  uint i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_int> *__range2;
  uint pos;
  SearchKey *searchKey_local;
  uint newRow_local;
  uint oldRow_local;
  BTreeImpl *this_local;
  
  __range2._4_4_ = 0;
  ___end2 = zeroTo<unsigned_int>(this->height);
  i = (uint)Range<unsigned_int>::begin((Range<unsigned_int> *)&__end2);
  local_40 = Range<unsigned_int>::end((Range<unsigned_int> *)&__end2);
  while( true ) {
    bVar1 = Range<unsigned_int>::Iterator::operator!=((Iterator *)&i,&local_40);
    if (!bVar1) {
      pNVar3 = this->tree + __range2._4_4_;
      uVar2 = (*searchKey->_vptr_SearchKey[1])(searchKey,pNVar3);
      bVar1 = MaybeUint::operator==
                        ((MaybeUint *)((long)&pNVar3->field_0 + (ulong)uVar2 * 4 + 8),oldRow);
      if (bVar1) {
        MaybeUint::operator=((MaybeUint *)((long)&pNVar3->field_0 + (ulong)uVar2 * 4 + 8),newRow);
      }
      else {
        logInconsistency(this);
      }
      return;
    }
    Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
    pNVar3 = this->tree + __range2._4_4_;
    f.exception._4_4_ = (**searchKey->_vptr_SearchKey)(searchKey,pNVar3);
    __range2._4_4_ = *(uint *)((long)&pNVar3->field_0 + (ulong)f.exception._4_4_ * 4 + 0x20);
    bVar1 = MaybeUint::operator==
                      ((MaybeUint *)((long)&pNVar3->field_0 + (ulong)f.exception._4_4_ * 4 + 4),
                       oldRow);
    if (bVar1) {
      MaybeUint::operator=
                ((MaybeUint *)((long)&pNVar3->field_0 + (ulong)f.exception._4_4_ * 4 + 4),newRow);
    }
    if (__range2._4_4_ == 0) break;
    Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
  }
  Debug::Fault::Fault(&local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                      ,0x263,FAILED,"pos != 0","");
  Debug::Fault::fatal(&local_60);
}

Assistant:

void BTreeImpl::renumber(uint oldRow, uint newRow, const SearchKey& searchKey) {
  // Renumber the given row from oldRow to newRow. predicate() returns true for oldRow and all
  // rows after it. (It will not be called on newRow.)

  uint pos = 0;

  for (auto i KJ_UNUSED: zeroTo(height)) {
    auto& node = tree[pos].parent;
    uint indexInParent = searchKey.search(node);
    pos = node.children[indexInParent];
    if (node.keys[indexInParent] == oldRow) {
      node.keys[indexInParent] = newRow;
    }
    KJ_DASSERT(pos != 0);
  }

  auto& leaf = tree[pos].leaf;
  uint r = searchKey.search(leaf);
  if (leaf.rows[r] == oldRow) {
    leaf.rows[r] = newRow;
  } else {
    logInconsistency();
  }
}